

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O0

boolean get_sof(j_decompress_ptr cinfo,boolean is_prog,boolean is_arith)

{
  byte bVar1;
  byte bVar2;
  undefined8 *puVar3;
  int iVar4;
  long lVar5;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long *in_RDI;
  int *_mp_1;
  int *_mp;
  size_t bytes_in_buffer;
  JOCTET *next_input_byte;
  jpeg_source_mgr *datasrc;
  jpeg_component_info *compptr;
  int ci;
  int c;
  JLONG length;
  long local_48;
  byte *local_40;
  uint *local_30;
  uint local_28;
  
  puVar3 = (undefined8 *)in_RDI[5];
  local_40 = (byte *)*puVar3;
  local_48 = puVar3[1];
  *(undefined4 *)(in_RDI + 0x27) = in_ESI;
  *(undefined4 *)((long)in_RDI + 0x13c) = in_EDX;
  if (local_48 == 0) {
    iVar4 = (*(code *)puVar3[3])(in_RDI);
    if (iVar4 == 0) {
      return 0;
    }
    local_40 = (byte *)*puVar3;
    local_48 = puVar3[1];
  }
  local_48 = local_48 + -1;
  bVar1 = *local_40;
  local_40 = local_40 + 1;
  if (local_48 == 0) {
    iVar4 = (*(code *)puVar3[3])(in_RDI);
    if (iVar4 == 0) {
      return 0;
    }
    local_40 = (byte *)*puVar3;
    local_48 = puVar3[1];
  }
  local_48 = local_48 + -1;
  bVar2 = *local_40;
  local_40 = local_40 + 1;
  if (local_48 == 0) {
    iVar4 = (*(code *)puVar3[3])(in_RDI);
    if (iVar4 == 0) {
      return 0;
    }
    local_40 = (byte *)*puVar3;
    local_48 = puVar3[1];
  }
  local_48 = local_48 + -1;
  *(uint *)(in_RDI + 0x25) = (uint)*local_40;
  local_40 = local_40 + 1;
  if (local_48 == 0) {
    iVar4 = (*(code *)puVar3[3])(in_RDI);
    if (iVar4 == 0) {
      return 0;
    }
    local_40 = (byte *)*puVar3;
    local_48 = puVar3[1];
  }
  local_48 = local_48 + -1;
  *(uint *)((long)in_RDI + 0x34) = (uint)*local_40 << 8;
  local_40 = local_40 + 1;
  if (local_48 == 0) {
    iVar4 = (*(code *)puVar3[3])(in_RDI);
    if (iVar4 == 0) {
      return 0;
    }
    local_40 = (byte *)*puVar3;
    local_48 = puVar3[1];
  }
  local_48 = local_48 + -1;
  *(uint *)((long)in_RDI + 0x34) = (uint)*local_40 + *(int *)((long)in_RDI + 0x34);
  local_40 = local_40 + 1;
  if (local_48 == 0) {
    iVar4 = (*(code *)puVar3[3])(in_RDI);
    if (iVar4 == 0) {
      return 0;
    }
    local_40 = (byte *)*puVar3;
    local_48 = puVar3[1];
  }
  local_48 = local_48 + -1;
  *(uint *)(in_RDI + 6) = (uint)*local_40 << 8;
  local_40 = local_40 + 1;
  if (local_48 == 0) {
    iVar4 = (*(code *)puVar3[3])(in_RDI);
    if (iVar4 == 0) {
      return 0;
    }
    local_40 = (byte *)*puVar3;
    local_48 = puVar3[1];
  }
  local_48 = local_48 + -1;
  *(uint *)(in_RDI + 6) = (uint)*local_40 + (int)in_RDI[6];
  local_40 = local_40 + 1;
  if (local_48 == 0) {
    iVar4 = (*(code *)puVar3[3])(in_RDI);
    if (iVar4 == 0) {
      return 0;
    }
    local_40 = (byte *)*puVar3;
    local_48 = puVar3[1];
  }
  *(uint *)(in_RDI + 7) = (uint)*local_40;
  lVar5 = *in_RDI;
  *(undefined4 *)(lVar5 + 0x2c) = *(undefined4 *)((long)in_RDI + 0x21c);
  *(int *)(lVar5 + 0x30) = (int)in_RDI[6];
  *(undefined4 *)(lVar5 + 0x34) = *(undefined4 *)((long)in_RDI + 0x34);
  *(int *)(lVar5 + 0x38) = (int)in_RDI[7];
  *(undefined4 *)(*in_RDI + 0x28) = 100;
  (**(code **)(*in_RDI + 8))(in_RDI,1);
  if (*(int *)(in_RDI[0x49] + 0x1c) != 0) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x3a;
    (**(code **)*in_RDI)(in_RDI);
  }
  if (((*(int *)((long)in_RDI + 0x34) == 0) || ((int)in_RDI[6] == 0)) || ((int)in_RDI[7] < 1)) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x20;
    (**(code **)*in_RDI)(in_RDI);
  }
  if ((ulong)bVar2 + (ulong)bVar1 * 0x100 + -8 != (long)((int)in_RDI[7] * 3)) {
    *(undefined4 *)(*in_RDI + 0x28) = 0xb;
    (**(code **)*in_RDI)(in_RDI);
  }
  if (in_RDI[0x26] == 0) {
    lVar5 = (**(code **)in_RDI[1])(in_RDI,1,(long)(int)in_RDI[7] * 0x60);
    in_RDI[0x26] = lVar5;
  }
  local_28 = 0;
  local_30 = (uint *)in_RDI[0x26];
  do {
    local_40 = local_40 + 1;
    local_48 = local_48 + -1;
    if ((int)in_RDI[7] <= (int)local_28) {
      *(undefined4 *)(in_RDI[0x49] + 0x1c) = 1;
      *puVar3 = local_40;
      puVar3[1] = local_48;
      return 1;
    }
    local_30[1] = local_28;
    if (local_48 == 0) {
      iVar4 = (*(code *)puVar3[3])(in_RDI);
      if (iVar4 == 0) {
        return 0;
      }
      local_40 = (byte *)*puVar3;
      local_48 = puVar3[1];
    }
    local_48 = local_48 + -1;
    *local_30 = (uint)*local_40;
    local_40 = local_40 + 1;
    if (local_48 == 0) {
      iVar4 = (*(code *)puVar3[3])(in_RDI);
      if (iVar4 == 0) {
        return 0;
      }
      local_40 = (byte *)*puVar3;
      local_48 = puVar3[1];
    }
    local_48 = local_48 + -1;
    bVar1 = *local_40;
    local_30[2] = (int)(uint)bVar1 >> 4;
    local_30[3] = bVar1 & 0xf;
    local_40 = local_40 + 1;
    if (local_48 == 0) {
      iVar4 = (*(code *)puVar3[3])(in_RDI);
      if (iVar4 == 0) {
        return 0;
      }
      local_40 = (byte *)*puVar3;
      local_48 = puVar3[1];
    }
    local_30[4] = (uint)*local_40;
    lVar5 = *in_RDI;
    *(uint *)(lVar5 + 0x2c) = *local_30;
    *(uint *)(lVar5 + 0x30) = local_30[2];
    *(uint *)(lVar5 + 0x34) = local_30[3];
    *(uint *)(lVar5 + 0x38) = local_30[4];
    *(undefined4 *)(*in_RDI + 0x28) = 0x65;
    (**(code **)(*in_RDI + 8))(in_RDI,1);
    local_28 = local_28 + 1;
    local_30 = local_30 + 0x18;
  } while( true );
}

Assistant:

LOCAL(boolean)
get_sof(j_decompress_ptr cinfo, boolean is_prog, boolean is_arith)
/* Process a SOFn marker */
{
  JLONG length;
  int c, ci;
  jpeg_component_info *compptr;
  INPUT_VARS(cinfo);

  cinfo->progressive_mode = is_prog;
  cinfo->arith_code = is_arith;

  INPUT_2BYTES(cinfo, length, return FALSE);

  INPUT_BYTE(cinfo, cinfo->data_precision, return FALSE);
  INPUT_2BYTES(cinfo, cinfo->image_height, return FALSE);
  INPUT_2BYTES(cinfo, cinfo->image_width, return FALSE);
  INPUT_BYTE(cinfo, cinfo->num_components, return FALSE);

  length -= 8;

  TRACEMS4(cinfo, 1, JTRC_SOF, cinfo->unread_marker,
           (int)cinfo->image_width, (int)cinfo->image_height,
           cinfo->num_components);

  if (cinfo->marker->saw_SOF)
    ERREXIT(cinfo, JERR_SOF_DUPLICATE);

  /* We don't support files in which the image height is initially specified */
  /* as 0 and is later redefined by DNL.  As long as we have to check that,  */
  /* might as well have a general sanity check. */
  if (cinfo->image_height <= 0 || cinfo->image_width <= 0 ||
      cinfo->num_components <= 0)
    ERREXIT(cinfo, JERR_EMPTY_IMAGE);

  if (length != (cinfo->num_components * 3))
    ERREXIT(cinfo, JERR_BAD_LENGTH);

  if (cinfo->comp_info == NULL) /* do only once, even if suspend */
    cinfo->comp_info = (jpeg_component_info *)(*cinfo->mem->alloc_small)
                        ((j_common_ptr)cinfo, JPOOL_IMAGE,
                         cinfo->num_components * sizeof(jpeg_component_info));

  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    compptr->component_index = ci;
    INPUT_BYTE(cinfo, compptr->component_id, return FALSE);
    INPUT_BYTE(cinfo, c, return FALSE);
    compptr->h_samp_factor = (c >> 4) & 15;
    compptr->v_samp_factor = (c     ) & 15;
    INPUT_BYTE(cinfo, compptr->quant_tbl_no, return FALSE);

    TRACEMS4(cinfo, 1, JTRC_SOF_COMPONENT,
             compptr->component_id, compptr->h_samp_factor,
             compptr->v_samp_factor, compptr->quant_tbl_no);
  }

  cinfo->marker->saw_SOF = TRUE;

  INPUT_SYNC(cinfo);
  return TRUE;
}